

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void ym2610b_update_one(void *chip,UINT32 length,DEV_SMPL **buffer)

{
  FM_OPN *OPN;
  FM_CH *CH;
  FM_CH *CH_00;
  FM_CH *CH_01;
  FM_CH *CH_02;
  FM_CH *CH_03;
  FM_CH *CH_04;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int chnum;
  int chnum_00;
  int chnum_01;
  int chnum_02;
  int chnum_03;
  int chnum_04;
  long lVar17;
  ulong uVar18;
  DEV_SMPL *local_60;
  DEV_SMPL *local_58;
  
  OPN = (FM_OPN *)((long)chip + 0x208);
  if (buffer == (DEV_SMPL **)0x0) {
    local_58 = (DEV_SMPL *)0x0;
    local_60 = (DEV_SMPL *)0x0;
  }
  else {
    local_60 = *buffer;
    local_58 = buffer[1];
  }
  CH = (FM_CH *)((long)chip + 0x4778);
  CH_00 = (FM_CH *)((long)chip + 0x4910);
  CH_01 = (FM_CH *)((long)chip + 0x4aa8);
  CH_02 = (FM_CH *)((long)chip + 0x4c40);
  CH_03 = (FM_CH *)((long)chip + 0x4dd8);
  CH_04 = (FM_CH *)((long)chip + 0x4f70);
  refresh_fc_eg_chan(OPN,CH);
  refresh_fc_eg_chan(OPN,CH_00);
  if ((*(byte *)((long)chip + 0x230) & 0xc0) == 0) {
    refresh_fc_eg_chan(OPN,CH_01);
  }
  else if (*(int *)((long)chip + 0x4ad0) == -1) {
    refresh_fc_eg_slot(OPN,(FM_SLOT *)CH_01,*(int *)((long)chip + 0x684),
                       (uint)*(byte *)((long)chip + 0x68e));
    refresh_fc_eg_slot(OPN,(FM_SLOT *)((long)chip + 0x4b48),*(int *)((long)chip + 0x688),
                       (uint)*(byte *)((long)chip + 0x68f));
    refresh_fc_eg_slot(OPN,(FM_SLOT *)((long)chip + 0x4af8),*(int *)((long)chip + 0x680),
                       (uint)*(byte *)((long)chip + 0x68d));
    refresh_fc_eg_slot(OPN,(FM_SLOT *)((long)chip + 0x4b98),*(int *)((long)chip + 0x4c2c),
                       (uint)*(byte *)((long)chip + 0x4c30));
  }
  refresh_fc_eg_chan(OPN,CH_02);
  refresh_fc_eg_chan(OPN,CH_03);
  refresh_fc_eg_chan(OPN,CH_04);
  if (length == 0) {
    update_ssg_eg_channel((FM_SLOT *)CH);
    update_ssg_eg_channel((FM_SLOT *)CH_00);
    update_ssg_eg_channel((FM_SLOT *)CH_01);
    update_ssg_eg_channel((FM_SLOT *)CH_02);
    update_ssg_eg_channel((FM_SLOT *)CH_03);
    update_ssg_eg_channel((FM_SLOT *)CH_04);
  }
  for (uVar18 = 0; uVar18 != length; uVar18 = uVar18 + 1) {
    *(undefined4 *)((long)chip + 0x4738) = 0;
    *(undefined8 *)((long)chip + 0x4730) = 0;
    *(undefined4 *)((long)chip + 0x4748) = 0;
    *(undefined8 *)((long)chip + 0x4740) = 0;
    *(undefined8 *)((long)chip + 0x4714) = 0;
    *(undefined8 *)((long)chip + 0x471c) = 0;
    *(undefined8 *)((long)chip + 0x4724) = 0;
    update_ssg_eg_channel((FM_SLOT *)CH);
    update_ssg_eg_channel((FM_SLOT *)CH_00);
    update_ssg_eg_channel((FM_SLOT *)CH_01);
    update_ssg_eg_channel((FM_SLOT *)CH_02);
    update_ssg_eg_channel((FM_SLOT *)CH_03);
    update_ssg_eg_channel((FM_SLOT *)CH_04);
    chan_calc(OPN,CH,chnum);
    chan_calc(OPN,CH_00,chnum_00);
    chan_calc(OPN,CH_01,chnum_01);
    chan_calc(OPN,CH_02,chnum_02);
    chan_calc(OPN,CH_03,chnum_03);
    chan_calc(OPN,CH_04,chnum_04);
    if ((*(char *)((long)chip + 0x53d2) < '\0') && (*(char *)((long)chip + 0x5408) == '\0')) {
      YM_DELTAT_ADPCM_CALC((YM_DELTAT *)((long)chip + 0x5368));
    }
    for (lVar17 = 0x5120; lVar17 != 0x52a0; lVar17 = lVar17 + 0x40) {
      if (*(char *)((long)chip + lVar17) != '\0') {
        ADPCMA_calc_chan((YM2610 *)chip,(ADPCM_CH *)((long)chip + lVar17));
      }
    }
    advance_lfo(OPN);
    uVar14 = *(int *)((long)chip + 0x6dc) + *(int *)((long)chip + 0x6e0);
    *(uint *)((long)chip + 0x6dc) = uVar14;
    while (*(uint *)((long)chip + 0x6e4) <= uVar14) {
      *(uint *)((long)chip + 0x6dc) = uVar14 - *(uint *)((long)chip + 0x6e4);
      *(int *)((long)chip + 0x6d8) = *(int *)((long)chip + 0x6d8) + 1;
      advance_eg_channel(OPN,(FM_SLOT *)CH);
      advance_eg_channel(OPN,(FM_SLOT *)CH_00);
      advance_eg_channel(OPN,(FM_SLOT *)CH_01);
      advance_eg_channel(OPN,(FM_SLOT *)CH_02);
      advance_eg_channel(OPN,(FM_SLOT *)CH_03);
      advance_eg_channel(OPN,(FM_SLOT *)CH_04);
      uVar14 = *(uint *)((long)chip + 0x6dc);
    }
    iVar1 = *(int *)((long)chip + 0x4738);
    iVar15 = *(int *)((long)chip + 0x4730);
    iVar16 = *(int *)((long)chip + 0x4748);
    iVar2 = *(int *)((long)chip + 0x4740);
    uVar14 = *(uint *)((long)chip + 0x4714);
    uVar3 = *(uint *)((long)chip + 0x4718);
    uVar4 = *(uint *)((long)chip + 0x6ac);
    uVar5 = *(uint *)((long)chip + 0x6b4);
    uVar6 = *(uint *)((long)chip + 0x471c);
    uVar7 = *(uint *)((long)chip + 0x6bc);
    uVar8 = *(uint *)((long)chip + 0x4720);
    uVar9 = *(uint *)((long)chip + 0x6c4);
    uVar10 = *(uint *)((long)chip + 0x4724);
    uVar11 = *(uint *)((long)chip + 0x6cc);
    uVar12 = *(uint *)((long)chip + 0x4728);
    uVar13 = *(uint *)((long)chip + 0x6d4);
    local_60[uVar18] =
         (*(uint *)((long)chip + 0x6d0) & uVar12) +
         (*(uint *)((long)chip + 0x6c8) & uVar10) + (*(uint *)((long)chip + 0x6c0) & uVar8) +
         (*(uint *)((long)chip + 0x6b8) & uVar6) +
         (*(uint *)((long)chip + 0x6b0) & uVar3) + (*(uint *)((long)chip + 0x6a8) & uVar14) +
         (*(int *)((long)chip + 0x4744) + iVar16 >> 8) + (*(int *)((long)chip + 0x4734) + iVar1) * 2
    ;
    local_58[uVar18] =
         (uVar12 & uVar13) + (uVar10 & uVar11) + (uVar8 & uVar9) +
         (uVar6 & uVar7) + (uVar3 & uVar5) + (uVar14 & uVar4) +
         (iVar16 + iVar2 >> 8) + (iVar1 + iVar15) * 2;
    *(char *)((long)chip + 0x69c) = *(char *)((long)chip + 0x69c) << 1;
    iVar1 = *(int *)((long)chip + 0x23c);
    if (((iVar1 != 0) && (*(long *)((long)chip + 0x648) == 0)) &&
       (iVar16 = (int)(*(double *)((long)chip + 0x220) * 4096.0), iVar15 = iVar1 - iVar16,
       *(int *)((long)chip + 0x23c) = iVar15, iVar15 == 0 || iVar1 < iVar16)) {
      TimerAOver((FM_ST *)((long)chip + 0x210));
      if ((*(uint *)((long)chip + 0x230) & 0xc0) == 0x80) {
        CSMKeyControl(OPN,CH_01);
      }
    }
    if ((*(byte *)((long)chip + 0x69c) & 2) != 0) {
      FM_KEYOFF_CSM(CH_01,0);
      FM_KEYOFF_CSM(CH_01,2);
      FM_KEYOFF_CSM(CH_01,1);
      FM_KEYOFF_CSM(CH_01,3);
      *(undefined1 *)((long)chip + 0x69c) = 0;
    }
  }
  iVar1 = *(int *)((long)chip + 0x244);
  if (((iVar1 != 0) && (*(long *)((long)chip + 0x648) == 0)) &&
     (iVar16 = (int)((double)length * *(double *)((long)chip + 0x220) * 4096.0),
     iVar15 = iVar1 - iVar16, *(int *)((long)chip + 0x244) = iVar15, iVar15 == 0 || iVar1 < iVar16))
  {
    TimerBOver((FM_ST *)((long)chip + 0x210));
    return;
  }
  return;
}

Assistant:

void ym2610b_update_one(void *chip, UINT32 length, DEV_SMPL **buffer)
{
	YM2610 *F2610 = (YM2610 *)chip;
	FM_OPN *OPN   = &F2610->OPN;
	YM_DELTAT *DELTAT = &F2610->deltaT;
	UINT32 i;
	UINT8 j;
	DEV_SMPL  *bufL,*bufR;
	FM_CH   *cch[6];
	INT32 *out_fm = OPN->out_fm;

	/* buffer setup */
	if (buffer != NULL)
	{
		bufL = buffer[0];
		bufR = buffer[1];
	}
	else
	{
		bufL = bufR = NULL;
	}

	cch[0] = &F2610->CH[0];
	cch[1] = &F2610->CH[1];
	cch[2] = &F2610->CH[2];
	cch[3] = &F2610->CH[3];
	cch[4] = &F2610->CH[4];
	cch[5] = &F2610->CH[5];

	/* refresh PG and EG */
	refresh_fc_eg_chan( OPN, cch[0] );
	refresh_fc_eg_chan( OPN, cch[1] );
	if( (OPN->ST.mode & 0xc0) )
	{
		/* 3SLOT MODE */
		if( cch[2]->SLOT[SLOT1].Incr==-1)
		{
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT1] , OPN->SL3.fc[1] , OPN->SL3.kcode[1] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT2] , OPN->SL3.fc[2] , OPN->SL3.kcode[2] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT3] , OPN->SL3.fc[0] , OPN->SL3.kcode[0] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT4] , cch[2]->fc , cch[2]->kcode );
		}
	}
	else
		refresh_fc_eg_chan( OPN, cch[2] );
	refresh_fc_eg_chan( OPN, cch[3] );
	refresh_fc_eg_chan( OPN, cch[4] );
	refresh_fc_eg_chan( OPN, cch[5] );
	if (! length)
	{
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5]->SLOT[SLOT1]);
	}

	/* buffering */
	for(i=0; i < length ; i++)
	{
		/* clear output acc. */
		OPN->out_adpcm[OUTD_LEFT] = OPN->out_adpcm[OUTD_RIGHT] = OPN->out_adpcm[OUTD_CENTER] = 0;
		OPN->out_delta[OUTD_LEFT] = OPN->out_delta[OUTD_RIGHT] = OPN->out_delta[OUTD_CENTER] = 0;
		/* clear outputs */
		out_fm[0] = 0;
		out_fm[1] = 0;
		out_fm[2] = 0;
		out_fm[3] = 0;
		out_fm[4] = 0;
		out_fm[5] = 0;

		/* update SSG-EG output */
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5]->SLOT[SLOT1]);

		/* calculate FM */
		chan_calc(OPN, cch[0], 0 );
		chan_calc(OPN, cch[1], 1 );
		chan_calc(OPN, cch[2], 2 );
		chan_calc(OPN, cch[3], 3 );
		chan_calc(OPN, cch[4], 4 );
		chan_calc(OPN, cch[5], 5 );

		/* deltaT ADPCM */
		if( DELTAT->portstate&0x80 && ! F2610->MuteDeltaT )
			YM_DELTAT_ADPCM_CALC(DELTAT);

		/* ADPCMA */
		for( j = 0; j < 6; j++ )
		{
			if( F2610->adpcm[j].flag )
				ADPCMA_calc_chan( F2610, &F2610->adpcm[j]);
		}

		/* advance LFO */
		advance_lfo(OPN);

		/* advance envelope generator */
		OPN->eg_timer += OPN->eg_timer_add;
		while (OPN->eg_timer >= OPN->eg_timer_overflow)
		{
			OPN->eg_timer -= OPN->eg_timer_overflow;
			OPN->eg_cnt++;

			advance_eg_channel(OPN, &cch[0]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[1]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[2]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[3]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[4]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[5]->SLOT[SLOT1]);
		}


		/* buffering */
		{
			DEV_SMPL lt,rt;

			lt =  (OPN->out_adpcm[OUTD_LEFT]  + OPN->out_adpcm[OUTD_CENTER])<<1;
			rt =  (OPN->out_adpcm[OUTD_RIGHT] + OPN->out_adpcm[OUTD_CENTER])<<1;
			lt += (OPN->out_delta[OUTD_LEFT]  + OPN->out_delta[OUTD_CENTER])>>8;
			rt += (OPN->out_delta[OUTD_RIGHT] + OPN->out_delta[OUTD_CENTER])>>8;

			lt += (out_fm[0] & OPN->pan[0]);
			rt += (out_fm[0] & OPN->pan[1]);
			lt += (out_fm[1] & OPN->pan[2]);
			rt += (out_fm[1] & OPN->pan[3]);
			lt += (out_fm[2] & OPN->pan[4]);
			rt += (out_fm[2] & OPN->pan[5]);
			lt += (out_fm[3] & OPN->pan[6]);
			rt += (out_fm[3] & OPN->pan[7]);
			lt += (out_fm[4] & OPN->pan[8]);
			rt += (out_fm[4] & OPN->pan[9]);
			lt += (out_fm[5] & OPN->pan[10]);
			rt += (out_fm[5] & OPN->pan[11]);

			//lt >>= 1; // the shift right is verified on YM2610
			//rt >>= 1;

			/* buffering */
			bufL[i] = lt;
			bufR[i] = rt;
		}

		/* CSM mode: if CSM Key ON has occured, CSM Key OFF need to be sent       */
		/* only if Timer A does not overflow again (i.e CSM Key ON not set again) */
		OPN->SL3.key_csm <<= 1;

		/* timer A control */
		INTERNAL_TIMER_A( &OPN->ST , cch[2] )

		/* CSM Mode Key ON still disabled */
		if (OPN->SL3.key_csm & 2)
		{
			/* CSM Mode Key OFF (verified by Nemesis on real hardware) */
			FM_KEYOFF_CSM(cch[2],SLOT1);
			FM_KEYOFF_CSM(cch[2],SLOT2);
			FM_KEYOFF_CSM(cch[2],SLOT3);
			FM_KEYOFF_CSM(cch[2],SLOT4);
			OPN->SL3.key_csm = 0;
		}
	}

	/* timer B control */
	INTERNAL_TIMER_B(&OPN->ST,length)
}